

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFileValNotExist(int count,char **names)

{
  bool_t bVar1;
  int iVar2;
  uint uVar3;
  file_t file;
  long lVar4;
  
  if (count == 0) {
    return 0;
  }
  lVar4 = 0;
  while (file = fileOpen(names[lVar4],"rb"), file == (file_t)0x0) {
    lVar4 = lVar4 + 1;
    if (count == (int)lVar4) {
      return 0;
    }
  }
  bVar1 = fileClose(file);
  if (bVar1 == 0) {
    return 0x67;
  }
  iVar2 = printf("Some files already exist. Overwrite [y/n]?");
  if (iVar2 < 0) {
    return 0xcc;
  }
  do {
    uVar3 = cmdTermGetch();
    if ((uVar3 - 0x4e < 0x2c) && ((0x80100000801U >> ((ulong)(uVar3 - 0x4e) & 0x3f) & 1) != 0))
    break;
  } while (uVar3 != 10);
  putchar(10);
  if (uVar3 != 10 && (uVar3 & 0x5f) != 0x4e) {
    return 0;
  }
  return 0xcc;
}

Assistant:

err_t cmdFileValNotExist(int count, char* names[])
{
	err_t code;
	file_t file;
	int ch;
	for (; count--; names++)
	{
		ASSERT(strIsValid(*names));
		code = cmdFileOpen(file, *names, "rb");
		if (code == ERR_OK)
		{
			code = cmdFileClose(file);
			ERR_CALL_CHECK(code);
			if (printf("Some files already exist. Overwrite [y/n]?") < 0)
				return ERR_FILE_EXISTS;
			do
				ch = cmdTermGetch();
			while (ch != 'Y' && ch != 'y' && ch != 'N' && ch != 'n' && ch != '\n');
			printf("\n");
			if (ch == 'N' || ch == 'n' || ch == '\n')
				return ERR_FILE_EXISTS;
			break;
		}
	}
	return ERR_OK;
}